

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O2

void getBundlePath(char **path,uint *pathLength)

{
  uchar uVar1;
  char *executablePath;
  uint bundlePathLength;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *local_40;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    local_40 = (char *)0x0;
    local_2c = 0;
    getExecutablePath(&local_40,&local_2c);
    local_30 = 0;
    getDirectoryPart(local_40,local_2c,&local_30);
    unifyPathDelimiters(local_40,local_30);
    local_34 = 0;
    getBundlePart(local_40,local_30,&local_34);
    if (local_34 == 0) {
      free(local_40);
      invalidateStringOutParameter(path,pathLength);
    }
    else {
      copyToStringOutParameter(local_40,local_34,path,pathLength);
      free(local_40);
    }
  }
  return;
}

Assistant:

void getBundlePath(char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Get directory where the executable is located
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);

    // Extract directory part from executable path (without trailing slash)
    unsigned int executablePathDirectoryLength = 0;
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Convert to canonical path
    unifyPathDelimiters(executablePath, executablePathDirectoryLength);

    // check for /Contents/MacOS
    unsigned int bundlePathLength = 0;
    getBundlePart(executablePath, executablePathDirectoryLength, &bundlePathLength);

    if (bundlePathLength == 0) // No bundle
    {
        free(executablePath);
        invalidateStringOutParameter(path, pathLength);
        return;
    }

    // Copy contents to caller, create caller ownership
    copyToStringOutParameter(executablePath, bundlePathLength, path, pathLength);

    free(executablePath);
}